

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sw_trace_striped_sse2_128_16.c
# Opt level: O1

parasail_result_t *
parasail_sw_trace_striped_profile_sse2_128_16
          (parasail_profile_t *profile,char *s2,int s2Len,int open,int gap)

{
  ushort uVar1;
  ulong uVar3;
  undefined8 *puVar4;
  ushort *puVar5;
  short *psVar6;
  ushort *puVar7;
  uint uVar8;
  void *pvVar9;
  parasail_matrix_t *ppVar10;
  int *piVar11;
  bool bVar12;
  short sVar13;
  short sVar14;
  short sVar15;
  short sVar16;
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  int iVar21;
  parasail_result_t *result;
  __m128i *b;
  __m128i *palVar22;
  __m128i *b_00;
  __m128i *palVar23;
  __m128i *ptr;
  __m128i *ptr_00;
  long lVar24;
  ulong uVar25;
  ulong uVar26;
  long lVar27;
  int iVar28;
  __m128i *palVar29;
  ulong uVar30;
  int iVar31;
  longlong extraout_RDX;
  longlong extraout_RDX_00;
  long lVar32;
  long lVar33;
  __m128i *palVar34;
  uint a;
  long lVar35;
  int iVar36;
  ulong uVar37;
  uint uVar38;
  __m128i *ptr_01;
  bool bVar39;
  undefined4 uVar40;
  undefined4 uVar41;
  undefined1 auVar42 [16];
  ushort uVar43;
  ushort uVar44;
  ushort uVar48;
  ushort uVar50;
  ushort uVar52;
  ushort uVar54;
  ushort uVar55;
  ushort uVar56;
  ushort uVar57;
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  ushort uVar49;
  ushort uVar51;
  ushort uVar53;
  undefined1 auVar47 [16];
  ushort uVar60;
  ushort uVar61;
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  short sVar62;
  short sVar64;
  short sVar65;
  short sVar66;
  short sVar67;
  short sVar68;
  short sVar69;
  short sVar70;
  undefined1 auVar63 [16];
  ushort uVar71;
  ushort uVar72;
  ushort uVar73;
  ushort uVar74;
  ushort uVar75;
  ushort uVar76;
  ushort uVar77;
  ushort uVar78;
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  short sVar82;
  short sVar84;
  short sVar85;
  short sVar86;
  undefined1 auVar83 [16];
  undefined1 auVar87 [16];
  undefined1 auVar88 [16];
  __m128i c;
  __m128i c_00;
  __m128i c_01;
  undefined4 local_110;
  long local_f8;
  __m128i *local_e8;
  ulong local_d8;
  undefined1 local_58 [16];
  ushort uVar2;
  
  if (profile == (parasail_profile_t *)0x0) {
    parasail_sw_trace_striped_profile_sse2_128_16_cold_8();
  }
  else {
    pvVar9 = (profile->profile16).score;
    if (pvVar9 == (void *)0x0) {
      parasail_sw_trace_striped_profile_sse2_128_16_cold_7();
    }
    else {
      ppVar10 = profile->matrix;
      if (ppVar10 == (parasail_matrix_t *)0x0) {
        parasail_sw_trace_striped_profile_sse2_128_16_cold_6();
      }
      else {
        uVar8 = profile->s1Len;
        if ((int)uVar8 < 1) {
          parasail_sw_trace_striped_profile_sse2_128_16_cold_5();
        }
        else if (s2 == (char *)0x0) {
          parasail_sw_trace_striped_profile_sse2_128_16_cold_4();
        }
        else if (s2Len < 1) {
          parasail_sw_trace_striped_profile_sse2_128_16_cold_3();
        }
        else if (open < 0) {
          parasail_sw_trace_striped_profile_sse2_128_16_cold_2();
        }
        else if (gap < 0) {
          parasail_sw_trace_striped_profile_sse2_128_16_cold_1();
        }
        else {
          uVar37 = (ulong)uVar8 + 7 >> 3;
          iVar21 = ppVar10->max;
          a = (uint)uVar37;
          result = parasail_result_new_trace(a,s2Len,0x10,0x10);
          if (result != (parasail_result_t *)0x0) {
            result->flag = result->flag | 0x8280804;
            b = parasail_memalign___m128i(0x10,uVar37);
            palVar22 = parasail_memalign___m128i(0x10,uVar37);
            b_00 = parasail_memalign___m128i(0x10,uVar37);
            palVar23 = parasail_memalign___m128i(0x10,uVar37);
            ptr = parasail_memalign___m128i(0x10,uVar37);
            ptr_00 = parasail_memalign___m128i(0x10,uVar37);
            local_e8 = parasail_memalign___m128i(0x10,uVar37);
            if (b == (__m128i *)0x0) {
              return (parasail_result_t *)0x0;
            }
            if (palVar22 == (__m128i *)0x0) {
              return (parasail_result_t *)0x0;
            }
            if (b_00 == (__m128i *)0x0) {
              return (parasail_result_t *)0x0;
            }
            if (palVar23 == (__m128i *)0x0) {
              return (parasail_result_t *)0x0;
            }
            if (ptr == (__m128i *)0x0) {
              return (parasail_result_t *)0x0;
            }
            if (ptr_00 == (__m128i *)0x0) {
              return (parasail_result_t *)0x0;
            }
            if (local_e8 == (__m128i *)0x0) {
              return (parasail_result_t *)0x0;
            }
            auVar42 = pshuflw(ZEXT416((uint)open),ZEXT416((uint)open),0);
            uVar40 = auVar42._0_4_;
            auVar42 = pshuflw(ZEXT416((uint)gap),ZEXT416((uint)gap),0);
            uVar41 = auVar42._0_4_;
            c[1] = (longlong)palVar23;
            c[0] = uVar37;
            palVar29 = local_e8;
            parasail_memset___m128i(b,c,(size_t)local_e8);
            uVar38 = -open;
            pshuflw(ZEXT416(uVar38),ZEXT416(uVar38),0);
            c_00[1] = extraout_RDX;
            c_00[0] = uVar37;
            parasail_memset___m128i(b_00,c_00,(size_t)palVar29);
            c_01[1] = extraout_RDX_00;
            c_01[0] = uVar37;
            parasail_memset___m128i(palVar23,c_01,(size_t)palVar29);
            lVar32 = uVar37 * 0x10;
            lVar24 = 0;
            do {
              puVar4 = (undefined8 *)((long)((result->field_4).rowcols)->score_row + lVar24);
              *puVar4 = 0x8000800080008;
              puVar4[1] = 0x8000800080008;
              lVar24 = lVar24 + 0x10;
            } while (lVar32 != lVar24);
            auVar42._4_4_ = uVar40;
            auVar42._0_4_ = uVar40;
            auVar42._8_4_ = uVar40;
            auVar42._12_4_ = uVar40;
            auVar42 = psubsw((undefined1  [16])0x0,auVar42);
            uVar25 = 1;
            if (1 < s2Len) {
              uVar25 = (ulong)(uint)s2Len;
            }
            lVar24 = (ulong)(a + (a == 0)) << 4;
            local_110 = 0x8000;
            lVar35 = 0;
            iVar36 = 0;
            uVar71 = 0;
            uVar72 = 0;
            uVar73 = 0;
            uVar74 = 0;
            uVar75 = 0;
            uVar76 = 0;
            uVar77 = 0;
            uVar78 = 0;
            local_58 = (undefined1  [16])0x0;
            uVar26 = 0;
            local_f8 = lVar32;
            do {
              palVar29 = b;
              ptr_01 = ptr;
              ptr = palVar23;
              lVar27 = uVar37 * (long)ppVar10->mapper[(byte)s2[uVar26]];
              b = palVar22;
              if (iVar36 == (int)uVar26 + -2) {
                b = local_e8;
                local_e8 = palVar22;
              }
              uVar3 = palVar29[a - 1][0];
              auVar81._0_8_ = uVar3 << 0x10;
              auVar81._8_8_ = palVar29[a - 1][1] << 0x10 | uVar3 >> 0x30;
              uVar3 = uVar26 + 1;
              uVar30 = 1;
              lVar33 = 0;
              auVar58 = auVar42;
              do {
                auVar83 = *(undefined1 (*) [16])((long)*b_00 + lVar33);
                auVar81 = paddsw(auVar81,*(undefined1 (*) [16])
                                          ((long)pvVar9 + lVar33 + lVar27 * 0x10));
                uVar49 = (ushort)(-1 < auVar81._0_2_) * auVar81._0_2_;
                uVar44 = (ushort)(-1 < auVar81._2_2_) * auVar81._2_2_;
                uVar1 = (ushort)(-1 < auVar81._4_2_) * auVar81._4_2_;
                uVar2 = (ushort)(-1 < auVar81._6_2_) * auVar81._6_2_;
                uVar61 = (ushort)(-1 < auVar81._8_2_) * auVar81._8_2_;
                uVar60 = (ushort)(-1 < auVar81._10_2_) * auVar81._10_2_;
                uVar53 = (ushort)(-1 < auVar81._12_2_) * auVar81._12_2_;
                uVar51 = (ushort)(-1 < auVar81._14_2_) * auVar81._14_2_;
                sVar13 = auVar83._0_2_;
                uVar43 = (ushort)((short)uVar49 < sVar13) * sVar13 |
                         ((short)uVar49 >= sVar13) * uVar49;
                sVar13 = auVar83._2_2_;
                uVar48 = (ushort)((short)uVar44 < sVar13) * sVar13 |
                         ((short)uVar44 >= sVar13) * uVar44;
                sVar13 = auVar83._4_2_;
                uVar50 = (ushort)((short)uVar1 < sVar13) * sVar13 | ((short)uVar1 >= sVar13) * uVar1
                ;
                sVar13 = auVar83._6_2_;
                uVar52 = (ushort)((short)uVar2 < sVar13) * sVar13 | ((short)uVar2 >= sVar13) * uVar2
                ;
                sVar13 = auVar83._8_2_;
                uVar54 = (ushort)((short)uVar61 < sVar13) * sVar13 |
                         ((short)uVar61 >= sVar13) * uVar61;
                sVar13 = auVar83._10_2_;
                uVar55 = (ushort)((short)uVar60 < sVar13) * sVar13 |
                         ((short)uVar60 >= sVar13) * uVar60;
                sVar13 = auVar83._12_2_;
                uVar56 = (ushort)((short)uVar53 < sVar13) * sVar13 |
                         ((short)uVar53 >= sVar13) * uVar53;
                sVar13 = auVar83._14_2_;
                uVar57 = (ushort)((short)uVar51 < sVar13) * sVar13 |
                         ((short)uVar51 >= sVar13) * uVar51;
                sVar13 = auVar58._0_2_;
                auVar87._0_2_ =
                     (ushort)((short)uVar43 < sVar13) * sVar13 | ((short)uVar43 >= sVar13) * uVar43;
                sVar82 = auVar58._2_2_;
                auVar87._2_2_ =
                     (ushort)((short)uVar48 < sVar82) * sVar82 | ((short)uVar48 >= sVar82) * uVar48;
                sVar14 = auVar58._4_2_;
                auVar87._4_2_ =
                     (ushort)((short)uVar50 < sVar14) * sVar14 | ((short)uVar50 >= sVar14) * uVar50;
                sVar84 = auVar58._6_2_;
                auVar87._6_2_ =
                     (ushort)((short)uVar52 < sVar84) * sVar84 | ((short)uVar52 >= sVar84) * uVar52;
                sVar15 = auVar58._8_2_;
                auVar87._8_2_ =
                     (ushort)((short)uVar54 < sVar15) * sVar15 | ((short)uVar54 >= sVar15) * uVar54;
                sVar85 = auVar58._10_2_;
                auVar87._10_2_ =
                     (ushort)((short)uVar55 < sVar85) * sVar85 | ((short)uVar55 >= sVar85) * uVar55;
                sVar16 = auVar58._12_2_;
                auVar87._12_2_ =
                     (ushort)((short)uVar56 < sVar16) * sVar16 | ((short)uVar56 >= sVar16) * uVar56;
                sVar86 = auVar58._14_2_;
                auVar87._14_2_ =
                     (ushort)((short)uVar57 < sVar86) * sVar86 | ((short)uVar57 >= sVar86) * uVar57;
                *(undefined1 (*) [16])((long)*b + lVar33) = auVar87;
                uVar43 = ~-(ushort)(uVar49 == auVar87._0_2_) & 2 - (sVar13 < (short)uVar43) |
                         -(ushort)(0 < (short)auVar87._0_2_ && uVar49 == auVar87._0_2_) & 4;
                uVar48 = ~-(ushort)(uVar44 == auVar87._2_2_) & 2 - (sVar82 < (short)uVar48) |
                         -(ushort)(0 < (short)auVar87._2_2_ && uVar44 == auVar87._2_2_) & 4;
                uVar50 = ~-(ushort)(uVar1 == auVar87._4_2_) & 2 - (sVar14 < (short)uVar50) |
                         -(ushort)(0 < (short)auVar87._4_2_ && uVar1 == auVar87._4_2_) & 4;
                uVar52 = ~-(ushort)(uVar2 == auVar87._6_2_) & 2 - (sVar84 < (short)uVar52) |
                         -(ushort)(0 < (short)auVar87._6_2_ && uVar2 == auVar87._6_2_) & 4;
                uVar54 = ~-(ushort)(uVar61 == auVar87._8_2_) & 2 - (sVar15 < (short)uVar54) |
                         -(ushort)(0 < (short)auVar87._8_2_ && uVar61 == auVar87._8_2_) & 4;
                uVar55 = ~-(ushort)(uVar60 == auVar87._10_2_) & 2 - (sVar85 < (short)uVar55) |
                         -(ushort)(0 < (short)auVar87._10_2_ && uVar60 == auVar87._10_2_) & 4;
                uVar56 = ~-(ushort)(uVar53 == auVar87._12_2_) & 2 - (sVar16 < (short)uVar56) |
                         -(ushort)(0 < (short)auVar87._12_2_ && uVar53 == auVar87._12_2_) & 4;
                uVar57 = ~-(ushort)(uVar51 == auVar87._14_2_) & 2 - (sVar86 < (short)uVar57) |
                         -(ushort)(0 < (short)auVar87._14_2_ && uVar51 == auVar87._14_2_) & 4;
                puVar5 = (ushort *)((long)((result->field_4).rowcols)->score_row + lVar33 + lVar35);
                uVar44 = *puVar5;
                uVar49 = puVar5[1];
                uVar51 = puVar5[2];
                uVar53 = puVar5[3];
                uVar60 = puVar5[4];
                uVar61 = puVar5[5];
                uVar2 = puVar5[6];
                uVar1 = puVar5[7];
                puVar5 = (ushort *)((long)*ptr_00 + lVar33);
                *puVar5 = uVar43;
                puVar5[1] = uVar48;
                puVar5[2] = uVar50;
                puVar5[3] = uVar52;
                puVar5[4] = uVar54;
                puVar5[5] = uVar55;
                puVar5[6] = uVar56;
                puVar5[7] = uVar57;
                puVar5 = (ushort *)((long)((result->field_4).rowcols)->score_row + lVar33 + lVar35);
                *puVar5 = uVar44 | uVar43;
                puVar5[1] = uVar49 | uVar48;
                puVar5[2] = uVar51 | uVar50;
                puVar5[3] = uVar53 | uVar52;
                puVar5[4] = uVar60 | uVar54;
                puVar5[5] = uVar61 | uVar55;
                puVar5[6] = uVar2 | uVar56;
                puVar5[7] = uVar1 | uVar57;
                auVar19._4_4_ = uVar40;
                auVar19._0_4_ = uVar40;
                auVar19._8_4_ = uVar40;
                auVar19._12_4_ = uVar40;
                auVar45 = psubsw(auVar87,auVar19);
                auVar17._4_4_ = uVar41;
                auVar17._0_4_ = uVar41;
                auVar17._8_4_ = uVar41;
                auVar17._12_4_ = uVar41;
                auVar81 = psubsw(auVar83,auVar17);
                sVar13 = auVar45._0_2_;
                sVar82 = auVar81._0_2_;
                sVar14 = auVar45._2_2_;
                sVar84 = auVar81._2_2_;
                sVar15 = auVar45._4_2_;
                sVar85 = auVar81._4_2_;
                sVar16 = auVar45._6_2_;
                sVar86 = auVar81._6_2_;
                sVar62 = auVar45._8_2_;
                sVar64 = auVar81._8_2_;
                sVar65 = auVar45._10_2_;
                sVar66 = auVar81._10_2_;
                sVar67 = auVar45._12_2_;
                sVar68 = auVar81._12_2_;
                sVar70 = auVar81._14_2_;
                sVar69 = auVar45._14_2_;
                puVar5 = (ushort *)((long)*b_00 + lVar33);
                *puVar5 = (ushort)(sVar82 < sVar13) * sVar13 | (ushort)(sVar82 >= sVar13) * sVar82;
                puVar5[1] = (ushort)(sVar84 < sVar14) * sVar14 | (ushort)(sVar84 >= sVar14) * sVar84
                ;
                puVar5[2] = (ushort)(sVar85 < sVar15) * sVar15 | (ushort)(sVar85 >= sVar15) * sVar85
                ;
                puVar5[3] = (ushort)(sVar86 < sVar16) * sVar16 | (ushort)(sVar86 >= sVar16) * sVar86
                ;
                puVar5[4] = (ushort)(sVar64 < sVar62) * sVar62 | (ushort)(sVar64 >= sVar62) * sVar64
                ;
                puVar5[5] = (ushort)(sVar66 < sVar65) * sVar65 | (ushort)(sVar66 >= sVar65) * sVar66
                ;
                puVar5[6] = (ushort)(sVar68 < sVar67) * sVar67 | (ushort)(sVar68 >= sVar67) * sVar68
                ;
                puVar5[7] = (ushort)(sVar70 < sVar69) * sVar69 | (ushort)(sVar70 >= sVar69) * sVar70
                ;
                auVar81 = psubsw(*(undefined1 (*) [16])((long)*ptr + lVar33),auVar17);
                sVar82 = auVar81._0_2_;
                sVar84 = auVar81._2_2_;
                sVar85 = auVar81._4_2_;
                sVar86 = auVar81._6_2_;
                sVar64 = auVar81._8_2_;
                sVar66 = auVar81._10_2_;
                sVar68 = auVar81._12_2_;
                sVar70 = auVar81._14_2_;
                puVar5 = (ushort *)((long)*ptr_01 + lVar33);
                *puVar5 = (ushort)(sVar13 < sVar82) * sVar82 | (ushort)(sVar13 >= sVar82) * sVar13;
                puVar5[1] = (ushort)(sVar14 < sVar84) * sVar84 | (ushort)(sVar14 >= sVar84) * sVar14
                ;
                puVar5[2] = (ushort)(sVar15 < sVar85) * sVar85 | (ushort)(sVar15 >= sVar85) * sVar15
                ;
                puVar5[3] = (ushort)(sVar16 < sVar86) * sVar86 | (ushort)(sVar16 >= sVar86) * sVar16
                ;
                puVar5[4] = (ushort)(sVar62 < sVar64) * sVar64 | (ushort)(sVar62 >= sVar64) * sVar62
                ;
                puVar5[5] = (ushort)(sVar65 < sVar66) * sVar66 | (ushort)(sVar65 >= sVar66) * sVar65
                ;
                puVar5[6] = (ushort)(sVar67 < sVar68) * sVar68 | (ushort)(sVar67 >= sVar68) * sVar67
                ;
                puVar5[7] = (ushort)(sVar69 < sVar70) * sVar70 | (ushort)(sVar69 >= sVar70) * sVar69
                ;
                if (uVar3 < (uint)s2Len) {
                  puVar5 = (ushort *)
                           ((long)((result->field_4).rowcols)->score_row + lVar33 + local_f8);
                  *puVar5 = -(ushort)(sVar82 < sVar13) & 0x18 ^ 0x10;
                  puVar5[1] = -(ushort)(sVar84 < sVar14) & 0x18 ^ 0x10;
                  puVar5[2] = -(ushort)(sVar85 < sVar15) & 0x18 ^ 0x10;
                  puVar5[3] = -(ushort)(sVar86 < sVar16) & 0x18 ^ 0x10;
                  puVar5[4] = -(ushort)(sVar64 < sVar62) & 0x18 ^ 0x10;
                  puVar5[5] = -(ushort)(sVar66 < sVar65) & 0x18 ^ 0x10;
                  puVar5[6] = -(ushort)(sVar68 < sVar67) & 0x18 ^ 0x10;
                  puVar5[7] = -(ushort)(sVar70 < sVar69) & 0x18 ^ 0x10;
                }
                auVar83 = psubsw(auVar58,auVar17);
                sVar82 = auVar83._0_2_;
                sVar84 = auVar83._2_2_;
                sVar85 = auVar83._4_2_;
                sVar86 = auVar83._6_2_;
                sVar64 = auVar83._8_2_;
                sVar66 = auVar83._10_2_;
                sVar68 = auVar83._12_2_;
                sVar70 = auVar83._14_2_;
                if (uVar30 < uVar37) {
                  piVar11 = ((result->field_4).rowcols)->score_row;
                  puVar5 = (ushort *)((long)piVar11 + lVar33 + 0x10 + lVar35);
                  uVar44 = puVar5[1];
                  uVar49 = puVar5[2];
                  uVar51 = puVar5[3];
                  uVar53 = puVar5[4];
                  uVar60 = puVar5[5];
                  uVar61 = puVar5[6];
                  uVar2 = puVar5[7];
                  puVar7 = (ushort *)((long)piVar11 + lVar33 + 0x10 + lVar35);
                  *puVar7 = -(ushort)(sVar82 < sVar13) & 0x60 ^ 0x40 | *puVar5;
                  puVar7[1] = -(ushort)(sVar84 < sVar14) & 0x60 ^ 0x40 | uVar44;
                  puVar7[2] = -(ushort)(sVar85 < sVar15) & 0x60 ^ 0x40 | uVar49;
                  puVar7[3] = -(ushort)(sVar86 < sVar16) & 0x60 ^ 0x40 | uVar51;
                  puVar7[4] = -(ushort)(sVar64 < sVar62) & 0x60 ^ 0x40 | uVar53;
                  puVar7[5] = -(ushort)(sVar66 < sVar65) & 0x60 ^ 0x40 | uVar60;
                  puVar7[6] = -(ushort)(sVar68 < sVar67) & 0x60 ^ 0x40 | uVar61;
                  puVar7[7] = -(ushort)(sVar70 < sVar69) & 0x60 ^ 0x40 | uVar2;
                }
                uVar71 = ((short)uVar71 < (short)auVar87._0_2_) * auVar87._0_2_ |
                         ((short)uVar71 >= (short)auVar87._0_2_) * uVar71;
                uVar72 = ((short)uVar72 < (short)auVar87._2_2_) * auVar87._2_2_ |
                         ((short)uVar72 >= (short)auVar87._2_2_) * uVar72;
                uVar73 = ((short)uVar73 < (short)auVar87._4_2_) * auVar87._4_2_ |
                         ((short)uVar73 >= (short)auVar87._4_2_) * uVar73;
                uVar74 = ((short)uVar74 < (short)auVar87._6_2_) * auVar87._6_2_ |
                         ((short)uVar74 >= (short)auVar87._6_2_) * uVar74;
                uVar75 = ((short)uVar75 < (short)auVar87._8_2_) * auVar87._8_2_ |
                         ((short)uVar75 >= (short)auVar87._8_2_) * uVar75;
                uVar76 = ((short)uVar76 < (short)auVar87._10_2_) * auVar87._10_2_ |
                         ((short)uVar76 >= (short)auVar87._10_2_) * uVar76;
                uVar77 = ((short)uVar77 < (short)auVar87._12_2_) * auVar87._12_2_ |
                         ((short)uVar77 >= (short)auVar87._12_2_) * uVar77;
                uVar78 = ((short)uVar78 < (short)auVar87._14_2_) * auVar87._14_2_ |
                         ((short)uVar78 >= (short)auVar87._14_2_) * uVar78;
                auVar58._0_2_ =
                     (ushort)(sVar13 < sVar82) * sVar82 | (ushort)(sVar13 >= sVar82) * sVar13;
                auVar58._2_2_ =
                     (ushort)(sVar14 < sVar84) * sVar84 | (ushort)(sVar14 >= sVar84) * sVar14;
                auVar58._4_2_ =
                     (ushort)(sVar15 < sVar85) * sVar85 | (ushort)(sVar15 >= sVar85) * sVar15;
                auVar58._6_2_ =
                     (ushort)(sVar16 < sVar86) * sVar86 | (ushort)(sVar16 >= sVar86) * sVar16;
                auVar58._8_2_ =
                     (ushort)(sVar62 < sVar64) * sVar64 | (ushort)(sVar62 >= sVar64) * sVar62;
                auVar58._10_2_ =
                     (ushort)(sVar65 < sVar66) * sVar66 | (ushort)(sVar65 >= sVar66) * sVar65;
                auVar58._12_2_ =
                     (ushort)(sVar67 < sVar68) * sVar68 | (ushort)(sVar67 >= sVar68) * sVar67;
                auVar58._14_2_ =
                     (ushort)(sVar69 < sVar70) * sVar70 | (ushort)(sVar69 >= sVar70) * sVar69;
                auVar81 = *(undefined1 (*) [16])((long)*palVar29 + lVar33);
                lVar33 = lVar33 + 0x10;
                uVar30 = uVar30 + 1;
              } while (lVar24 != lVar33);
              iVar31 = 0;
              auVar88 = auVar58;
              do {
                uVar30 = auVar88._0_8_;
                auVar88._8_8_ = auVar88._8_8_ << 0x10 | uVar30 >> 0x30;
                uVar44 = (ushort)uVar38;
                auVar88._0_8_ = uVar30 << 0x10 | (ulong)uVar44;
                uVar30 = auVar83._0_8_;
                auVar83._8_8_ = auVar83._8_8_ << 0x10 | uVar30 >> 0x30;
                auVar83._0_8_ = uVar30 << 0x10 | 0x8000;
                auVar59._8_8_ = auVar58._8_8_ << 0x10 | auVar58._0_8_ >> 0x30;
                auVar59._0_8_ = auVar58._0_8_ << 0x10 | (ulong)uVar44;
                uVar30 = auVar45._0_8_;
                auVar45._8_8_ = auVar45._8_8_ << 0x10 | uVar30 >> 0x30;
                auVar45._0_8_ = uVar30 << 0x10 | (ulong)uVar44;
                uVar30 = palVar29[a - 1][0];
                auVar79._0_8_ = uVar30 << 0x10;
                auVar79._8_8_ = palVar29[a - 1][1] << 0x10 | uVar30 >> 0x30;
                lVar33 = 0;
                auVar58 = auVar59;
                do {
                  psVar6 = (short *)((long)*b + lVar33);
                  sVar62 = *psVar6;
                  sVar64 = psVar6[1];
                  sVar65 = psVar6[2];
                  sVar66 = psVar6[3];
                  sVar67 = psVar6[4];
                  sVar68 = psVar6[5];
                  sVar69 = psVar6[6];
                  sVar70 = psVar6[7];
                  sVar13 = auVar58._0_2_;
                  auVar80._0_2_ =
                       (ushort)(sVar62 < sVar13) * sVar13 | (ushort)(sVar62 >= sVar13) * sVar62;
                  sVar82 = auVar58._2_2_;
                  auVar80._2_2_ =
                       (ushort)(sVar64 < sVar82) * sVar82 | (ushort)(sVar64 >= sVar82) * sVar64;
                  sVar14 = auVar58._4_2_;
                  auVar80._4_2_ =
                       (ushort)(sVar65 < sVar14) * sVar14 | (ushort)(sVar65 >= sVar14) * sVar65;
                  sVar84 = auVar58._6_2_;
                  auVar80._6_2_ =
                       (ushort)(sVar66 < sVar84) * sVar84 | (ushort)(sVar66 >= sVar84) * sVar66;
                  sVar15 = auVar58._8_2_;
                  auVar80._8_2_ =
                       (ushort)(sVar67 < sVar15) * sVar15 | (ushort)(sVar67 >= sVar15) * sVar67;
                  sVar85 = auVar58._10_2_;
                  auVar80._10_2_ =
                       (ushort)(sVar68 < sVar85) * sVar85 | (ushort)(sVar68 >= sVar85) * sVar68;
                  sVar16 = auVar58._12_2_;
                  auVar80._12_2_ =
                       (ushort)(sVar69 < sVar16) * sVar16 | (ushort)(sVar69 >= sVar16) * sVar69;
                  sVar86 = auVar58._14_2_;
                  auVar80._14_2_ =
                       (ushort)(sVar70 < sVar86) * sVar86 | (ushort)(sVar70 >= sVar86) * sVar70;
                  *(undefined1 (*) [16])((long)*b + lVar33) = auVar80;
                  auVar81 = paddsw(auVar79,*(undefined1 (*) [16])
                                            ((long)pvVar9 + lVar33 + lVar27 * 0x10));
                  uVar43 = -(ushort)(sVar13 < sVar62 ||
                                    (ushort)((ushort)(-1 < auVar81._0_2_) * auVar81._0_2_) ==
                                    auVar80._0_2_);
                  uVar48 = -(ushort)(sVar82 < sVar64 ||
                                    (ushort)((ushort)(-1 < auVar81._2_2_) * auVar81._2_2_) ==
                                    auVar80._2_2_);
                  uVar50 = -(ushort)(sVar14 < sVar65 ||
                                    (ushort)((ushort)(-1 < auVar81._4_2_) * auVar81._4_2_) ==
                                    auVar80._4_2_);
                  uVar52 = -(ushort)(sVar84 < sVar66 ||
                                    (ushort)((ushort)(-1 < auVar81._6_2_) * auVar81._6_2_) ==
                                    auVar80._6_2_);
                  uVar54 = -(ushort)(sVar15 < sVar67 ||
                                    (ushort)((ushort)(-1 < auVar81._8_2_) * auVar81._8_2_) ==
                                    auVar80._8_2_);
                  uVar55 = -(ushort)(sVar85 < sVar68 ||
                                    (ushort)((ushort)(-1 < auVar81._10_2_) * auVar81._10_2_) ==
                                    auVar80._10_2_);
                  uVar56 = -(ushort)(sVar16 < sVar69 ||
                                    (ushort)((ushort)(-1 < auVar81._12_2_) * auVar81._12_2_) ==
                                    auVar80._12_2_);
                  uVar57 = -(ushort)(sVar86 < sVar70 ||
                                    (ushort)((ushort)(-1 < auVar81._14_2_) * auVar81._14_2_) ==
                                    auVar80._14_2_);
                  puVar5 = (ushort *)
                           ((long)((result->field_4).rowcols)->score_row + lVar33 + lVar35);
                  uVar44 = *puVar5;
                  uVar49 = puVar5[1];
                  uVar51 = puVar5[2];
                  uVar53 = puVar5[3];
                  uVar60 = puVar5[4];
                  uVar61 = puVar5[5];
                  uVar2 = puVar5[6];
                  uVar1 = puVar5[7];
                  puVar5 = (ushort *)((long)*ptr_00 + lVar33);
                  uVar43 = ~uVar43 & 2 | *puVar5 & uVar43;
                  uVar48 = ~uVar48 & 2 | puVar5[1] & uVar48;
                  uVar50 = ~uVar50 & 2 | puVar5[2] & uVar50;
                  uVar52 = ~uVar52 & 2 | puVar5[3] & uVar52;
                  uVar54 = ~uVar54 & 2 | puVar5[4] & uVar54;
                  uVar55 = ~uVar55 & 2 | puVar5[5] & uVar55;
                  uVar56 = ~uVar56 & 2 | puVar5[6] & uVar56;
                  uVar57 = ~uVar57 & 2 | puVar5[7] & uVar57;
                  puVar5 = (ushort *)((long)*ptr_00 + lVar33);
                  *puVar5 = uVar43;
                  puVar5[1] = uVar48;
                  puVar5[2] = uVar50;
                  puVar5[3] = uVar52;
                  puVar5[4] = uVar54;
                  puVar5[5] = uVar55;
                  puVar5[6] = uVar56;
                  puVar5[7] = uVar57;
                  puVar5 = (ushort *)
                           ((long)((result->field_4).rowcols)->score_row + lVar33 + lVar35);
                  *puVar5 = uVar43 | uVar44 & 0x78;
                  puVar5[1] = uVar48 | uVar49 & 0x78;
                  puVar5[2] = uVar50 | uVar51 & 0x78;
                  puVar5[3] = uVar52 | uVar53 & 0x78;
                  puVar5[4] = uVar54 | uVar60 & 0x78;
                  puVar5[5] = uVar55 | uVar61 & 0x78;
                  puVar5[6] = uVar56 | uVar2 & 0x78;
                  puVar5[7] = uVar57 | uVar1 & 0x78;
                  auVar18._4_4_ = uVar41;
                  auVar18._0_4_ = uVar41;
                  auVar18._8_4_ = uVar41;
                  auVar18._12_4_ = uVar41;
                  piVar11 = ((result->field_4).rowcols)->score_row;
                  puVar5 = (ushort *)((long)piVar11 + lVar33 + lVar35);
                  uVar44 = puVar5[1];
                  uVar49 = puVar5[2];
                  uVar51 = puVar5[3];
                  uVar53 = puVar5[4];
                  uVar60 = puVar5[5];
                  uVar61 = puVar5[6];
                  uVar2 = puVar5[7];
                  puVar7 = (ushort *)((long)piVar11 + lVar33 + lVar35);
                  *puVar7 = (*puVar5 & 0x1f | -(ushort)(auVar83._0_2_ < auVar45._0_2_) & 0x60) ^
                            0x40;
                  puVar7[1] = (uVar44 & 0x1f | -(ushort)(auVar83._2_2_ < auVar45._2_2_) & 0x60) ^
                              0x40;
                  puVar7[2] = (uVar49 & 0x1f | -(ushort)(auVar83._4_2_ < auVar45._4_2_) & 0x60) ^
                              0x40;
                  puVar7[3] = (uVar51 & 0x1f | -(ushort)(auVar83._6_2_ < auVar45._6_2_) & 0x60) ^
                              0x40;
                  puVar7[4] = (uVar53 & 0x1f | -(ushort)(auVar83._8_2_ < auVar45._8_2_) & 0x60) ^
                              0x40;
                  puVar7[5] = (uVar60 & 0x1f | -(ushort)(auVar83._10_2_ < auVar45._10_2_) & 0x60) ^
                              0x40;
                  puVar7[6] = (uVar61 & 0x1f | -(ushort)(auVar83._12_2_ < auVar45._12_2_) & 0x60) ^
                              0x40;
                  puVar7[7] = (uVar2 & 0x1f | -(ushort)(auVar83._14_2_ < auVar45._14_2_) & 0x60) ^
                              0x40;
                  auVar20._4_4_ = uVar40;
                  auVar20._0_4_ = uVar40;
                  auVar20._8_4_ = uVar40;
                  auVar20._12_4_ = uVar40;
                  auVar45 = psubsw(auVar80,auVar20);
                  auVar81 = psubsw(*(undefined1 (*) [16])((long)*ptr + lVar33),auVar18);
                  sVar13 = auVar81._0_2_;
                  sVar62 = auVar45._0_2_;
                  sVar82 = auVar81._2_2_;
                  sVar64 = auVar45._2_2_;
                  sVar14 = auVar81._4_2_;
                  sVar65 = auVar45._4_2_;
                  sVar84 = auVar81._6_2_;
                  sVar66 = auVar45._6_2_;
                  sVar15 = auVar81._8_2_;
                  sVar67 = auVar45._8_2_;
                  sVar85 = auVar81._10_2_;
                  sVar68 = auVar45._10_2_;
                  sVar16 = auVar81._12_2_;
                  sVar69 = auVar45._12_2_;
                  sVar70 = auVar45._14_2_;
                  sVar86 = auVar81._14_2_;
                  puVar5 = (ushort *)((long)*ptr_01 + lVar33);
                  *puVar5 = (ushort)(sVar62 < sVar13) * sVar13 | (ushort)(sVar62 >= sVar13) * sVar62
                  ;
                  puVar5[1] = (ushort)(sVar64 < sVar82) * sVar82 |
                              (ushort)(sVar64 >= sVar82) * sVar64;
                  puVar5[2] = (ushort)(sVar65 < sVar14) * sVar14 |
                              (ushort)(sVar65 >= sVar14) * sVar65;
                  puVar5[3] = (ushort)(sVar66 < sVar84) * sVar84 |
                              (ushort)(sVar66 >= sVar84) * sVar66;
                  puVar5[4] = (ushort)(sVar67 < sVar15) * sVar15 |
                              (ushort)(sVar67 >= sVar15) * sVar67;
                  puVar5[5] = (ushort)(sVar68 < sVar85) * sVar85 |
                              (ushort)(sVar68 >= sVar85) * sVar68;
                  puVar5[6] = (ushort)(sVar69 < sVar16) * sVar16 |
                              (ushort)(sVar69 >= sVar16) * sVar69;
                  puVar5[7] = (ushort)(sVar70 < sVar86) * sVar86 |
                              (ushort)(sVar70 >= sVar86) * sVar70;
                  if (uVar3 < (uint)s2Len) {
                    puVar5 = (ushort *)
                             ((long)((result->field_4).rowcols)->score_row + lVar33 + local_f8);
                    *puVar5 = -(ushort)(sVar13 < sVar62) & 0x18 ^ 0x10;
                    puVar5[1] = -(ushort)(sVar82 < sVar64) & 0x18 ^ 0x10;
                    puVar5[2] = -(ushort)(sVar14 < sVar65) & 0x18 ^ 0x10;
                    puVar5[3] = -(ushort)(sVar84 < sVar66) & 0x18 ^ 0x10;
                    puVar5[4] = -(ushort)(sVar15 < sVar67) & 0x18 ^ 0x10;
                    puVar5[5] = -(ushort)(sVar85 < sVar68) & 0x18 ^ 0x10;
                    puVar5[6] = -(ushort)(sVar16 < sVar69) & 0x18 ^ 0x10;
                    puVar5[7] = -(ushort)(sVar86 < sVar70) & 0x18 ^ 0x10;
                  }
                  uVar71 = ((short)uVar71 < (short)auVar80._0_2_) * auVar80._0_2_ |
                           ((short)uVar71 >= (short)auVar80._0_2_) * uVar71;
                  uVar72 = ((short)uVar72 < (short)auVar80._2_2_) * auVar80._2_2_ |
                           ((short)uVar72 >= (short)auVar80._2_2_) * uVar72;
                  uVar73 = ((short)uVar73 < (short)auVar80._4_2_) * auVar80._4_2_ |
                           ((short)uVar73 >= (short)auVar80._4_2_) * uVar73;
                  uVar74 = ((short)uVar74 < (short)auVar80._6_2_) * auVar80._6_2_ |
                           ((short)uVar74 >= (short)auVar80._6_2_) * uVar74;
                  uVar75 = ((short)uVar75 < (short)auVar80._8_2_) * auVar80._8_2_ |
                           ((short)uVar75 >= (short)auVar80._8_2_) * uVar75;
                  uVar76 = ((short)uVar76 < (short)auVar80._10_2_) * auVar80._10_2_ |
                           ((short)uVar76 >= (short)auVar80._10_2_) * uVar76;
                  uVar77 = ((short)uVar77 < (short)auVar80._12_2_) * auVar80._12_2_ |
                           ((short)uVar77 >= (short)auVar80._12_2_) * uVar77;
                  uVar78 = ((short)uVar78 < (short)auVar80._14_2_) * auVar80._14_2_ |
                           ((short)uVar78 >= (short)auVar80._14_2_) * uVar78;
                  auVar81 = psubsw(auVar58,auVar18);
                  auVar63._0_2_ = -(ushort)(auVar81._0_2_ < sVar62);
                  auVar63._2_2_ = -(ushort)(auVar81._2_2_ < sVar64);
                  auVar63._4_2_ = -(ushort)(auVar81._4_2_ < sVar65);
                  auVar63._6_2_ = -(ushort)(auVar81._6_2_ < sVar66);
                  auVar63._8_2_ = -(ushort)(auVar81._8_2_ < sVar67);
                  auVar63._10_2_ = -(ushort)(auVar81._10_2_ < sVar68);
                  auVar63._12_2_ = -(ushort)(auVar81._12_2_ < sVar69);
                  auVar63._14_2_ = -(ushort)(auVar81._14_2_ < sVar70);
                  bVar39 = (ushort)((ushort)(SUB161(auVar63 >> 7,0) & 1) |
                                    (ushort)(SUB161(auVar63 >> 0xf,0) & 1) << 1 |
                                    (ushort)(SUB161(auVar63 >> 0x17,0) & 1) << 2 |
                                    (ushort)(SUB161(auVar63 >> 0x1f,0) & 1) << 3 |
                                    (ushort)(SUB161(auVar63 >> 0x27,0) & 1) << 4 |
                                    (ushort)(SUB161(auVar63 >> 0x2f,0) & 1) << 5 |
                                    (ushort)(SUB161(auVar63 >> 0x37,0) & 1) << 6 |
                                    (ushort)(SUB161(auVar63 >> 0x3f,0) & 1) << 7 |
                                    (ushort)(SUB161(auVar63 >> 0x47,0) & 1) << 8 |
                                    (ushort)(SUB161(auVar63 >> 0x4f,0) & 1) << 9 |
                                    (ushort)(SUB161(auVar63 >> 0x57,0) & 1) << 10 |
                                    (ushort)(SUB161(auVar63 >> 0x5f,0) & 1) << 0xb |
                                    (ushort)(SUB161(auVar63 >> 0x67,0) & 1) << 0xc |
                                    (ushort)(SUB161(auVar63 >> 0x6f,0) & 1) << 0xd |
                                    (ushort)((byte)(auVar63._14_2_ >> 7) & 1) << 0xe |
                                   auVar63._14_2_ & 0x8000) == 0xffff;
                  bVar12 = !bVar39;
                  if (bVar39) {
                    iVar28 = 0x21;
                    goto LAB_006543e6;
                  }
                  auVar83 = psubsw(auVar88,auVar18);
                  sVar13 = auVar83._0_2_;
                  auVar88._0_2_ =
                       (ushort)(sVar62 < sVar13) * sVar13 | (ushort)(sVar62 >= sVar13) * sVar62;
                  sVar13 = auVar83._2_2_;
                  auVar88._2_2_ =
                       (ushort)(sVar64 < sVar13) * sVar13 | (ushort)(sVar64 >= sVar13) * sVar64;
                  sVar13 = auVar83._4_2_;
                  auVar88._4_2_ =
                       (ushort)(sVar65 < sVar13) * sVar13 | (ushort)(sVar65 >= sVar13) * sVar65;
                  sVar13 = auVar83._6_2_;
                  auVar88._6_2_ =
                       (ushort)(sVar66 < sVar13) * sVar13 | (ushort)(sVar66 >= sVar13) * sVar66;
                  sVar13 = auVar83._8_2_;
                  auVar88._8_2_ =
                       (ushort)(sVar67 < sVar13) * sVar13 | (ushort)(sVar67 >= sVar13) * sVar67;
                  sVar13 = auVar83._10_2_;
                  auVar88._10_2_ =
                       (ushort)(sVar68 < sVar13) * sVar13 | (ushort)(sVar68 >= sVar13) * sVar68;
                  sVar13 = auVar83._12_2_;
                  auVar88._12_2_ =
                       (ushort)(sVar69 < sVar13) * sVar13 | (ushort)(sVar69 >= sVar13) * sVar69;
                  sVar13 = auVar83._14_2_;
                  auVar88._14_2_ =
                       (ushort)(sVar70 < sVar13) * sVar13 | (ushort)(sVar70 >= sVar13) * sVar70;
                  auVar79 = *(undefined1 (*) [16])((long)*palVar29 + lVar33);
                  lVar33 = lVar33 + 0x10;
                  auVar58 = auVar81;
                } while (lVar24 != lVar33);
                iVar28 = 0;
LAB_006543e6:
                if (iVar28 != 0) {
                  if (iVar28 != 0x21) goto LAB_00654482;
                  break;
                }
                iVar31 = iVar31 + 1;
              } while (iVar31 != 8);
              auVar46._0_2_ = -(ushort)((short)local_58._0_2_ < (short)uVar71);
              auVar46._2_2_ = -(ushort)((short)local_58._2_2_ < (short)uVar72);
              auVar46._4_2_ = -(ushort)((short)local_58._4_2_ < (short)uVar73);
              auVar46._6_2_ = -(ushort)((short)local_58._6_2_ < (short)uVar74);
              auVar46._8_2_ = -(ushort)((short)local_58._8_2_ < (short)uVar75);
              auVar46._10_2_ = -(ushort)((short)local_58._10_2_ < (short)uVar76);
              auVar46._12_2_ = -(ushort)((short)local_58._12_2_ < (short)uVar77);
              auVar46._14_2_ = -(ushort)((short)local_58._14_2_ < (short)uVar78);
              bVar12 = true;
              if ((((((((((((((((auVar46 >> 7 & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
                               (auVar46 >> 0xf & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                              (auVar46 >> 0x17 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                             (auVar46 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                            (auVar46 >> 0x27 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                           (auVar46 >> 0x2f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                          (auVar46 >> 0x37 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                         (auVar46 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                        (auVar46 >> 0x47 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                       (auVar46 >> 0x4f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                      (auVar46 >> 0x57 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                     (auVar46 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                    (auVar46 >> 0x67 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                   (auVar46 >> 0x6f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                  (auVar46._14_2_ >> 7 & 1) != 0) || (auVar46._14_2_ & 0x8000) != 0) {
                uVar44 = ((short)uVar75 < (short)uVar71) * uVar71 |
                         ((short)uVar75 >= (short)uVar71) * uVar75;
                uVar49 = ((short)uVar76 < (short)uVar72) * uVar72 |
                         ((short)uVar76 >= (short)uVar72) * uVar76;
                uVar51 = ((short)uVar77 < (short)uVar73) * uVar73 |
                         ((short)uVar77 >= (short)uVar73) * uVar77;
                uVar53 = ((short)uVar78 < (short)uVar74) * uVar74 |
                         ((short)uVar78 >= (short)uVar74) * uVar78;
                sVar13 = (0 < (short)uVar75) * uVar75;
                sVar82 = (0 < (short)uVar76) * uVar76;
                sVar14 = (0 < (short)uVar77) * uVar77;
                sVar84 = (0 < (short)uVar78) * uVar78;
                uVar44 = ((short)uVar51 < (short)uVar44) * uVar44 |
                         ((short)uVar51 >= (short)uVar44) * uVar51;
                uVar49 = ((short)uVar53 < (short)uVar49) * uVar49 |
                         ((short)uVar53 >= (short)uVar49) * uVar53;
                uVar51 = (sVar13 < (short)uVar51) * uVar51 |
                         (ushort)(sVar13 >= (short)uVar51) * sVar13;
                uVar53 = (sVar82 < (short)uVar53) * uVar53 |
                         (ushort)(sVar82 >= (short)uVar53) * sVar82;
                uVar60 = (ushort)(sVar14 < sVar13) * sVar13 | (ushort)(sVar14 >= sVar13) * sVar14;
                uVar61 = (ushort)(sVar84 < sVar82) * sVar82 | (ushort)(sVar84 >= sVar82) * sVar84;
                sVar14 = (ushort)(0 < sVar14) * sVar14;
                sVar84 = (ushort)(0 < sVar84) * sVar84;
                uVar44 = ((short)uVar49 < (short)uVar44) * uVar44 |
                         ((short)uVar49 >= (short)uVar44) * uVar49;
                auVar47._0_4_ =
                     CONCAT22(((short)uVar51 < (short)uVar49) * uVar49 |
                              ((short)uVar51 >= (short)uVar49) * uVar51,uVar44);
                auVar47._4_2_ =
                     ((short)uVar53 < (short)uVar51) * uVar51 |
                     ((short)uVar53 >= (short)uVar51) * uVar53;
                auVar47._6_2_ =
                     ((short)uVar60 < (short)uVar53) * uVar53 |
                     ((short)uVar60 >= (short)uVar53) * uVar60;
                auVar47._8_2_ =
                     ((short)uVar61 < (short)uVar60) * uVar60 |
                     ((short)uVar61 >= (short)uVar60) * uVar61;
                auVar47._10_2_ =
                     (sVar14 < (short)uVar61) * uVar61 | (ushort)(sVar14 >= (short)uVar61) * sVar14;
                auVar47._12_2_ =
                     (ushort)(sVar84 < sVar14) * sVar14 | (ushort)(sVar84 >= sVar14) * sVar84;
                auVar47._14_2_ = (ushort)(0 < sVar84) * sVar84;
                local_110 = auVar47._0_4_;
                if ((short)(0x7ffe - (short)iVar21) < (short)uVar44) {
                  *(byte *)&result->flag = (byte)result->flag | 0x40;
                  bVar12 = false;
                }
                else {
                  auVar81 = pshuflw(auVar47,auVar47,0);
                  local_58._4_4_ = auVar81._0_4_;
                  local_58._0_4_ = local_58._4_4_;
                  local_58._8_4_ = local_58._4_4_;
                  local_58._12_4_ = local_58._4_4_;
                  iVar36 = (int)uVar26;
                }
              }
LAB_00654482:
              local_d8 = uVar26;
              if (!bVar12) break;
              local_f8 = local_f8 + lVar32;
              lVar35 = lVar35 + lVar32;
              uVar26 = uVar3;
              palVar23 = ptr_01;
              palVar22 = palVar29;
              local_d8 = uVar25;
            } while (uVar3 != uVar25);
            if ((short)local_110 == 0x7fff) {
              *(byte *)&result->flag = (byte)result->flag | 0x40;
            }
            iVar21 = parasail_result_is_saturated(result);
            iVar31 = 0;
            palVar23 = b;
            if (iVar21 == 0) {
              palVar34 = palVar29;
              palVar22 = local_e8;
              if (iVar36 == (int)local_d8 + -2) {
                palVar34 = local_e8;
                palVar22 = palVar29;
              }
              if (iVar36 == (int)local_d8 + -1) {
                palVar23 = local_e8;
                palVar22 = b;
                palVar34 = palVar29;
              }
              palVar29 = palVar34;
              local_e8 = palVar22;
              iVar21 = uVar8 - 1;
              if (((ulong)uVar8 + 7 & 0x7ffffff8) != 0) {
                uVar37 = 0;
                do {
                  if ((*(short *)((long)*local_e8 + uVar37 * 2) == (short)local_110) &&
                     (iVar31 = ((uint)uVar37 & 7) * a + ((uint)(uVar37 >> 3) & 0x1fffffff),
                     iVar31 < iVar21)) {
                    iVar21 = iVar31;
                  }
                  uVar37 = uVar37 + 1;
                } while ((a & 0xfffffff) << 3 != (int)uVar37);
              }
              iVar31 = (int)(short)local_110;
            }
            else {
              iVar36 = 0;
              iVar21 = 0;
            }
            result->score = iVar31;
            result->end_query = iVar21;
            result->end_ref = iVar36;
            parasail_free(local_e8);
            parasail_free(ptr_00);
            parasail_free(ptr);
            parasail_free(ptr_01);
            parasail_free(b_00);
            parasail_free(palVar29);
            parasail_free(palVar23);
            return result;
          }
        }
      }
    }
  }
  return (parasail_result_t *)0x0;
}

Assistant:

parasail_result_t* PNAME(
        const parasail_profile_t * const restrict profile,
        const char * const restrict s2, const int s2Len,
        const int open, const int gap)
{
    /* declare local variables */
    int32_t i = 0;
    int32_t j = 0;
    int32_t k = 0;
    int32_t end_query = 0;
    int32_t end_ref = 0;
    int32_t s1Len = 0;
    const parasail_matrix_t *matrix = NULL;
    int32_t segWidth = 0;
    int32_t segLen = 0;
    __m128i* restrict vProfile = NULL;
    __m128i* restrict pvHStore = NULL;
    __m128i* restrict pvHLoad = NULL;
    __m128i* restrict pvE = NULL;
    __m128i* restrict pvEaStore = NULL;
    __m128i* restrict pvEaLoad = NULL;
    __m128i* restrict pvHT = NULL;
    __m128i* restrict pvHMax = NULL;
    __m128i vGapO;
    __m128i vGapE;
    __m128i vZero;
    int16_t score = 0;
    __m128i vMaxH;
    __m128i vMaxHUnit;
    int16_t maxp = 0;
    parasail_result_t *result = NULL;
    __m128i vTZero;
    __m128i vTIns;
    __m128i vTDel;
    __m128i vTDiag;
    __m128i vTDiagE;
    __m128i vTInsE;
    __m128i vTDiagF;
    __m128i vTDelF;
    __m128i vTMask;
    __m128i vFTMask;

    /* validate inputs */
    PARASAIL_CHECK_NULL(profile);
    PARASAIL_CHECK_NULL(profile->profile16.score);
    PARASAIL_CHECK_NULL(profile->matrix);
    PARASAIL_CHECK_GT0(profile->s1Len);
    PARASAIL_CHECK_NULL(s2);
    PARASAIL_CHECK_GT0(s2Len);
    PARASAIL_CHECK_GE0(open);
    PARASAIL_CHECK_GE0(gap);

    /* initialize stack variables */
    i = 0;
    j = 0;
    k = 0;
    end_query = 0;
    end_ref = 0;
    s1Len = profile->s1Len;
    matrix = profile->matrix;
    segWidth = 8; /* number of values in vector unit */
    segLen = (s1Len + segWidth - 1) / segWidth;
    vProfile = (__m128i*)profile->profile16.score;
    vGapO = _mm_set1_epi16(open);
    vGapE = _mm_set1_epi16(gap);
    vZero = _mm_setzero_si128();
    score = NEG_INF;
    vMaxH = vZero;
    vMaxHUnit = vZero;
    maxp = INT16_MAX - (int16_t)(matrix->max+1);
    vTZero = _mm_set1_epi16(PARASAIL_ZERO);
    vTIns  = _mm_set1_epi16(PARASAIL_INS);
    vTDel  = _mm_set1_epi16(PARASAIL_DEL);
    vTDiag = _mm_set1_epi16(PARASAIL_DIAG);
    vTDiagE= _mm_set1_epi16(PARASAIL_DIAG_E);
    vTInsE = _mm_set1_epi16(PARASAIL_INS_E);
    vTDiagF= _mm_set1_epi16(PARASAIL_DIAG_F);
    vTDelF = _mm_set1_epi16(PARASAIL_DEL_F);
    vTMask = _mm_set1_epi16(PARASAIL_ZERO_MASK);
    vFTMask= _mm_set1_epi16(PARASAIL_F_MASK);

    /* initialize result */
    result = parasail_result_new_trace(segLen, s2Len, 16, sizeof(__m128i));
    if (!result) return NULL;

    /* set known flags */
    result->flag |= PARASAIL_FLAG_SW | PARASAIL_FLAG_STRIPED
        | PARASAIL_FLAG_TRACE
        | PARASAIL_FLAG_BITS_16 | PARASAIL_FLAG_LANES_8;

    /* initialize heap variables */
    pvHStore = parasail_memalign___m128i(16, segLen);
    pvHLoad =  parasail_memalign___m128i(16, segLen);
    pvE = parasail_memalign___m128i(16, segLen);
    pvEaStore = parasail_memalign___m128i(16, segLen);
    pvEaLoad = parasail_memalign___m128i(16, segLen);
    pvHT = parasail_memalign___m128i(16, segLen);
    pvHMax = parasail_memalign___m128i(16, segLen);

    /* validate heap variables */
    if (!pvHStore) return NULL;
    if (!pvHLoad) return NULL;
    if (!pvE) return NULL;
    if (!pvEaStore) return NULL;
    if (!pvEaLoad) return NULL;
    if (!pvHT) return NULL;
    if (!pvHMax) return NULL;

    /* initialize H and E */
    parasail_memset___m128i(pvHStore, vZero, segLen);
    parasail_memset___m128i(pvE, _mm_set1_epi16(-open), segLen);
    parasail_memset___m128i(pvEaStore, _mm_set1_epi16(-open), segLen);

    for (i=0; i<segLen; ++i) {
        arr_store(result->trace->trace_table, vTDiagE, i, segLen, 0);
    }

    /* outer loop over database sequence */
    for (j=0; j<s2Len; ++j) {
        __m128i vEF_opn;
        __m128i vE;
        __m128i vE_ext;
        __m128i vF;
        __m128i vF_ext;
        __m128i vFa;
        __m128i vFa_ext;
        __m128i vH;
        __m128i vH_dag;
        const __m128i* vP = NULL;

        /* Initialize F value to 0.  Any errors to vH values will be
         * corrected in the Lazy_F loop. */
        vF = _mm_subs_epi16(vZero,vGapO);

        /* load final segment of pvHStore and shift left by 2 bytes */
        vH = _mm_load_si128(&pvHStore[segLen - 1]);
        vH = _mm_slli_si128(vH, 2);

        /* Correct part of the vProfile */
        vP = vProfile + matrix->mapper[(unsigned char)s2[j]] * segLen;

        if (end_ref == j-2) {
            /* Swap in the max buffer. */
            SWAP3(pvHMax,  pvHLoad,  pvHStore)
            SWAP(pvEaLoad,  pvEaStore)
        }
        else {
            /* Swap the 2 H buffers. */
            SWAP(pvHLoad,  pvHStore)
            SWAP(pvEaLoad,  pvEaStore)
        }

        /* inner loop to process the query sequence */
        for (i=0; i<segLen; ++i) {
            vE = _mm_load_si128(pvE + i);

            /* Get max from vH, vE and vF. */
            vH_dag = _mm_adds_epi16(vH, _mm_load_si128(vP + i));
            vH_dag = _mm_max_epi16(vH_dag, vZero);
            vH = _mm_max_epi16(vH_dag, vE);
            vH = _mm_max_epi16(vH, vF);
            /* Save vH values. */
            _mm_store_si128(pvHStore + i, vH);

            {
                __m128i vTAll = arr_load(result->trace->trace_table, i, segLen, j);
                __m128i cond_zero = _mm_cmpeq_epi16(vH, vZero);
                __m128i case1 = _mm_cmpeq_epi16(vH, vH_dag);
                __m128i case2 = _mm_cmpeq_epi16(vH, vF);
                __m128i vT = _mm_blendv_epi8_rpl(
                        _mm_blendv_epi8_rpl(vTIns, vTDel, case2),
                        _mm_blendv_epi8_rpl(vTDiag, vTZero, cond_zero),
                        case1);
                _mm_store_si128(pvHT + i, vT);
                vT = _mm_or_si128(vT, vTAll);
                arr_store(result->trace->trace_table, vT, i, segLen, j);
            }
            vMaxH = _mm_max_epi16(vH, vMaxH);
            vEF_opn = _mm_subs_epi16(vH, vGapO);

            /* Update vE value. */
            vE_ext = _mm_subs_epi16(vE, vGapE);
            vE = _mm_max_epi16(vEF_opn, vE_ext);
            _mm_store_si128(pvE + i, vE);
            {
                __m128i vEa = _mm_load_si128(pvEaLoad + i);
                __m128i vEa_ext = _mm_subs_epi16(vEa, vGapE);
                vEa = _mm_max_epi16(vEF_opn, vEa_ext);
                _mm_store_si128(pvEaStore + i, vEa);
                if (j+1<s2Len) {
                    __m128i cond = _mm_cmpgt_epi16(vEF_opn, vEa_ext);
                    __m128i vT = _mm_blendv_epi8_rpl(vTInsE, vTDiagE, cond);
                    arr_store(result->trace->trace_table, vT, i, segLen, j+1);
                }
            }

            /* Update vF value. */
            vF_ext = _mm_subs_epi16(vF, vGapE);
            vF = _mm_max_epi16(vEF_opn, vF_ext);
            if (i+1<segLen) {
                __m128i vTAll = arr_load(result->trace->trace_table, i+1, segLen, j);
                __m128i cond = _mm_cmpgt_epi16(vEF_opn, vF_ext);
                __m128i vT = _mm_blendv_epi8_rpl(vTDelF, vTDiagF, cond);
                vT = _mm_or_si128(vT, vTAll);
                arr_store(result->trace->trace_table, vT, i+1, segLen, j);
            }

            /* Load the next vH. */
            vH = _mm_load_si128(pvHLoad + i);
        }

        /* Lazy_F loop: has been revised to disallow adjecent insertion and
         * then deletion, so don't update E(i, i), learn from SWPS3 */
        vFa_ext = vF_ext;
        vFa = vF;
        for (k=0; k<segWidth; ++k) {
            __m128i vHp = _mm_load_si128(&pvHLoad[segLen - 1]);
            vHp = _mm_slli_si128(vHp, 2);
            vEF_opn = _mm_slli_si128(vEF_opn, 2);
            vEF_opn = _mm_insert_epi16(vEF_opn, -open, 0);
            vF_ext = _mm_slli_si128(vF_ext, 2);
            vF_ext = _mm_insert_epi16(vF_ext, NEG_INF, 0);
            vF = _mm_slli_si128(vF, 2);
            vF = _mm_insert_epi16(vF, -open, 0);
            vFa_ext = _mm_slli_si128(vFa_ext, 2);
            vFa_ext = _mm_insert_epi16(vFa_ext, NEG_INF, 0);
            vFa = _mm_slli_si128(vFa, 2);
            vFa = _mm_insert_epi16(vFa, -open, 0);
            for (i=0; i<segLen; ++i) {
                vH = _mm_load_si128(pvHStore + i);
                vH = _mm_max_epi16(vH,vF);
                _mm_store_si128(pvHStore + i, vH);
                {
                    __m128i vTAll;
                    __m128i vT;
                    __m128i case1;
                    __m128i case2;
                    __m128i cond;
                    vHp = _mm_adds_epi16(vHp, _mm_load_si128(vP + i));
                    vHp = _mm_max_epi16(vHp, vZero);
                    case1 = _mm_cmpeq_epi16(vH, vHp);
                    case2 = _mm_cmpeq_epi16(vH, vF);
                    cond = _mm_andnot_si128(case1,case2);
                    vTAll = arr_load(result->trace->trace_table, i, segLen, j);
                    vT = _mm_load_si128(pvHT + i);
                    vT = _mm_blendv_epi8_rpl(vT, vTDel, cond);
                    _mm_store_si128(pvHT + i, vT);
                    vTAll = _mm_and_si128(vTAll, vTMask);
                    vTAll = _mm_or_si128(vTAll, vT);
                    arr_store(result->trace->trace_table, vTAll, i, segLen, j);
                }
                vMaxH = _mm_max_epi16(vH, vMaxH);
                /* Update vF value. */
                {
                    __m128i vTAll = arr_load(result->trace->trace_table, i, segLen, j);
                    __m128i cond = _mm_cmpgt_epi16(vEF_opn, vFa_ext);
                    __m128i vT = _mm_blendv_epi8_rpl(vTDelF, vTDiagF, cond);
                    vTAll = _mm_and_si128(vTAll, vFTMask);
                    vTAll = _mm_or_si128(vTAll, vT);
                    arr_store(result->trace->trace_table, vTAll, i, segLen, j);
                }
                vEF_opn = _mm_subs_epi16(vH, vGapO);
                vF_ext = _mm_subs_epi16(vF, vGapE);
                {
                    __m128i vEa = _mm_load_si128(pvEaLoad + i);
                    __m128i vEa_ext = _mm_subs_epi16(vEa, vGapE);
                    vEa = _mm_max_epi16(vEF_opn, vEa_ext);
                    _mm_store_si128(pvEaStore + i, vEa);
                    if (j+1<s2Len) {
                        __m128i cond = _mm_cmpgt_epi16(vEF_opn, vEa_ext);
                        __m128i vT = _mm_blendv_epi8_rpl(vTInsE, vTDiagE, cond);
                        arr_store(result->trace->trace_table, vT, i, segLen, j+1);
                    }
                }
                if (! _mm_movemask_epi8(
                            _mm_or_si128(
                                _mm_cmpgt_epi16(vF_ext, vEF_opn),
                                _mm_cmpeq_epi16(vF_ext, vEF_opn))))
                    goto end;
                /*vF = _mm_max_epi16(vEF_opn, vF_ext);*/
                vF = vF_ext;
                vFa_ext = _mm_subs_epi16(vFa, vGapE);
                vFa = _mm_max_epi16(vEF_opn, vFa_ext);
                vHp = _mm_load_si128(pvHLoad + i);
            }
        }
end:
        {
        }

        {
            __m128i vCompare = _mm_cmpgt_epi16(vMaxH, vMaxHUnit);
            if (_mm_movemask_epi8(vCompare)) {
                score = _mm_hmax_epi16_rpl(vMaxH);
                /* if score has potential to overflow, abort early */
                if (score > maxp) {
                    result->flag |= PARASAIL_FLAG_SATURATED;
                    break;
                }
                vMaxHUnit = _mm_set1_epi16(score);
                end_ref = j;
            }
        }

        /*if (score == stop) break;*/
    }

    if (score == INT16_MAX) {
        result->flag |= PARASAIL_FLAG_SATURATED;
    }

    if (parasail_result_is_saturated(result)) {
        score = 0;
        end_query = 0;
        end_ref = 0;
    }
    else {
        if (end_ref == j-1) {
            /* end_ref was the last store column */
            SWAP(pvHMax,  pvHStore)
        }
        else if (end_ref == j-2) {
            /* end_ref was the last load column */
            SWAP(pvHMax,  pvHLoad)
        }
        /* Trace the alignment ending position on read. */
        {
            int16_t *t = (int16_t*)pvHMax;
            int32_t column_len = segLen * segWidth;
            end_query = s1Len - 1;
            for (i = 0; i<column_len; ++i, ++t) {
                if (*t == score) {
                    int32_t temp = i / segWidth + i % segWidth * segLen;
                    if (temp < end_query) {
                        end_query = temp;
                    }
                }
            }
        }
    }

    result->score = score;
    result->end_query = end_query;
    result->end_ref = end_ref;

    parasail_free(pvHMax);
    parasail_free(pvHT);
    parasail_free(pvEaLoad);
    parasail_free(pvEaStore);
    parasail_free(pvE);
    parasail_free(pvHLoad);
    parasail_free(pvHStore);

    return result;
}